

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O3

void altsvc_flush(altsvcinfo *asi,alpnid srcalpnid,char *srchost,unsigned_short srcport)

{
  Curl_llist_node *n;
  _Bool _Var1;
  Curl_llist_node *pCVar2;
  undefined8 *puVar3;
  
  pCVar2 = Curl_llist_head(&asi->list);
  while (n = pCVar2, n != (Curl_llist_node *)0x0) {
    puVar3 = (undefined8 *)Curl_node_elem(n);
    pCVar2 = Curl_node_next(n);
    if (((*(alpnid *)((long)puVar3 + 0xc) == srcalpnid) &&
        (*(unsigned_short *)(puVar3 + 1) == srcport)) &&
       (_Var1 = hostcompare(srchost,(char *)*puVar3), _Var1)) {
      Curl_node_remove(n);
      (*Curl_cfree)((void *)*puVar3);
      (*Curl_cfree)((void *)puVar3[2]);
      (*Curl_cfree)(puVar3);
    }
  }
  return;
}

Assistant:

static void altsvc_flush(struct altsvcinfo *asi, enum alpnid srcalpnid,
                         const char *srchost, unsigned short srcport)
{
  struct Curl_llist_node *e;
  struct Curl_llist_node *n;
  for(e = Curl_llist_head(&asi->list); e; e = n) {
    struct altsvc *as = Curl_node_elem(e);
    n = Curl_node_next(e);
    if((srcalpnid == as->src.alpnid) &&
       (srcport == as->src.port) &&
       hostcompare(srchost, as->src.host)) {
      Curl_node_remove(e);
      altsvc_free(as);
    }
  }
}